

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_operator.c
# Opt level: O2

HPDF_STATUS
HPDF_Page_SetTextMatrix
          (HPDF_Page page,HPDF_REAL a,HPDF_REAL b,HPDF_REAL c,HPDF_REAL d,HPDF_REAL x,HPDF_REAL y)

{
  char *eptr;
  void *pvVar1;
  HPDF_STATUS HVar2;
  char *pcVar3;
  char buf [512];
  
  HVar2 = HPDF_Page_CheckState(page,4);
  if (HVar2 == 0) {
    pvVar1 = page->attr;
    if ((((a == 0.0) && (!NAN(a))) || ((d == 0.0 && (!NAN(d))))) &&
       (((b == 0.0 && (!NAN(b))) || ((c == 0.0 && (!NAN(c))))))) {
      HVar2 = HPDF_RaiseError(page->error,0x1039,0);
      return HVar2;
    }
    eptr = buf + 0x1ff;
    HPDF_MemSet(buf,'\0',0x200);
    pcVar3 = HPDF_FToA(buf,a,eptr);
    *pcVar3 = ' ';
    pcVar3 = HPDF_FToA(pcVar3 + 1,b,eptr);
    *pcVar3 = ' ';
    pcVar3 = HPDF_FToA(pcVar3 + 1,c,eptr);
    *pcVar3 = ' ';
    pcVar3 = HPDF_FToA(pcVar3 + 1,d,eptr);
    *pcVar3 = ' ';
    pcVar3 = HPDF_FToA(pcVar3 + 1,x,eptr);
    *pcVar3 = ' ';
    pcVar3 = HPDF_FToA(pcVar3 + 1,y,eptr);
    HPDF_StrCpy(pcVar3," Tm\n",eptr);
    HVar2 = HPDF_Stream_WriteStr(*(HPDF_Stream *)((long)pvVar1 + 0x70),buf);
    if (HVar2 == 0) {
      *(HPDF_REAL *)((long)pvVar1 + 0x48) = a;
      *(HPDF_REAL *)((long)pvVar1 + 0x4c) = b;
      *(HPDF_REAL *)((long)pvVar1 + 0x50) = c;
      *(HPDF_REAL *)((long)pvVar1 + 0x54) = d;
      *(HPDF_REAL *)((long)pvVar1 + 0x58) = x;
      *(HPDF_REAL *)((long)pvVar1 + 0x5c) = y;
      *(HPDF_REAL *)((long)pvVar1 + 0x40) = x;
      *(HPDF_REAL *)((long)pvVar1 + 0x44) = y;
      HVar2 = 0;
    }
    else {
      HVar2 = HPDF_CheckError(page->error);
    }
  }
  return HVar2;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Page_SetTextMatrix  (HPDF_Page         page,
                          HPDF_REAL    a,
                          HPDF_REAL    b,
                          HPDF_REAL    c,
                          HPDF_REAL    d,
                          HPDF_REAL    x,
                          HPDF_REAL    y)
{
    HPDF_STATUS ret = HPDF_Page_CheckState (page, HPDF_GMODE_TEXT_OBJECT);
    char buf[HPDF_TMP_BUF_SIZ];
    char *pbuf = buf;
    char *eptr = buf + HPDF_TMP_BUF_SIZ - 1;
    HPDF_PageAttr attr;

    HPDF_PTRACE ((" HPDF_Page_SetTextMatrix\n"));

    if (ret != HPDF_OK)
        return ret;

    attr = (HPDF_PageAttr)page->attr;

    if ((a == 0 || d == 0) && (b == 0 || c == 0))
        return HPDF_RaiseError (page->error, HPDF_INVALID_PARAMETER, 0);

    HPDF_MemSet (buf, 0, HPDF_TMP_BUF_SIZ);

    pbuf = HPDF_FToA (pbuf, a, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, b, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, c, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, d, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, x, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, y, eptr);
    HPDF_StrCpy (pbuf, " Tm\012", eptr);

    if (HPDF_Stream_WriteStr (attr->stream, buf) != HPDF_OK)
        return HPDF_CheckError (page->error);

    attr->text_matrix.a = a;
    attr->text_matrix.b = b;
    attr->text_matrix.c = c;
    attr->text_matrix.d = d;
    attr->text_matrix.x = x;
    attr->text_matrix.y = y;
    attr->text_pos.x = attr->text_matrix.x;
    attr->text_pos.y = attr->text_matrix.y;

    return ret;
}